

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_surjectionproof_verify
              (secp256k1_context *ctx,secp256k1_surjectionproof *proof,
              secp256k1_generator *ephemeral_input_tags,size_t n_ephemeral_input_tags,
              secp256k1_generator *ephemeral_output_tag)

{
  ulong uVar1;
  int iVar2;
  uchar *b32;
  long lVar3;
  void *pvVar4;
  secp256k1_scalar *r;
  char *pcVar5;
  size_t rsizes [1];
  uchar msg32 [32];
  secp256k1_scalar borromean_s [256];
  secp256k1_gej ring_pubkeys [256];
  size_t *in_stack_ffffffffffff5f70;
  size_t local_a060;
  int local_a058 [8];
  secp256k1_scalar local_a038 [256];
  secp256k1_gej local_8038 [256];
  
  if ((ctx->ecmult_ctx).pre_g == (secp256k1_ge_storage_0_ *)0x0) {
    pvVar4 = (ctx->illegal_callback).data;
    pcVar5 = "secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx)";
  }
  else if (proof == (secp256k1_surjectionproof *)0x0) {
    pvVar4 = (ctx->illegal_callback).data;
    pcVar5 = "proof != NULL";
  }
  else if (ephemeral_input_tags == (secp256k1_generator *)0x0) {
    pvVar4 = (ctx->illegal_callback).data;
    pcVar5 = "ephemeral_input_tags != NULL";
  }
  else {
    if (ephemeral_output_tag != (secp256k1_generator *)0x0) {
      uVar1 = proof->n_inputs;
      local_a060 = secp256k1_surjectionproof_n_used_inputs(ctx,proof);
      if (0x100 < local_a060) {
        return 0;
      }
      if (uVar1 == n_ephemeral_input_tags) {
        if (uVar1 <= local_a060 - 1) {
          return 0;
        }
        secp256k1_surjection_compute_public_keys
                  (local_8038,(size_t)ephemeral_input_tags,
                   (secp256k1_generator *)n_ephemeral_input_tags,(size_t)proof->used_inputs,
                   ephemeral_output_tag->data,(secp256k1_generator *)0x0,0,in_stack_ffffffffffff5f70
                  );
        lVar3 = local_a060 + 1;
        b32 = proof->data;
        r = local_a038;
        do {
          b32 = b32 + 0x20;
          lVar3 = lVar3 + -1;
          if (lVar3 == 0) {
            secp256k1_surjection_genmessage
                      ((uchar *)local_a058,ephemeral_input_tags,n_ephemeral_input_tags,
                       ephemeral_output_tag);
            iVar2 = secp256k1_borromean_verify
                              (&ctx->ecmult_ctx,(secp256k1_scalar *)0x0,proof->data,local_a038,
                               local_8038,&local_a060,1,(uchar *)local_a058,0x20);
            return iVar2;
          }
          local_a058[0] = 0;
          secp256k1_scalar_set_b32(r,b32,local_a058);
          r = r + 1;
        } while (local_a058[0] != 1);
        return 0;
      }
      return 0;
    }
    pvVar4 = (ctx->illegal_callback).data;
    pcVar5 = "ephemeral_output_tag != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar5,pvVar4);
  return 0;
}

Assistant:

int secp256k1_surjectionproof_verify(const secp256k1_context* ctx, const secp256k1_surjectionproof* proof, const secp256k1_generator* ephemeral_input_tags, size_t n_ephemeral_input_tags, const secp256k1_generator* ephemeral_output_tag) {
    size_t rsizes[1];    /* array needed for borromean sig API */
    size_t i;
    size_t n_total_pubkeys;
    size_t n_used_pubkeys;
    secp256k1_gej ring_pubkeys[SECP256K1_SURJECTIONPROOF_MAX_USED_INPUTS];
    secp256k1_scalar borromean_s[SECP256K1_SURJECTIONPROOF_MAX_USED_INPUTS];
    unsigned char msg32[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(proof != NULL);
    ARG_CHECK(ephemeral_input_tags != NULL);
    ARG_CHECK(ephemeral_output_tag != NULL);

    /* Compute public keys */
    n_total_pubkeys = secp256k1_surjectionproof_n_total_inputs(ctx, proof);
    n_used_pubkeys = secp256k1_surjectionproof_n_used_inputs(ctx, proof);
    if (n_used_pubkeys == 0 || n_used_pubkeys > n_total_pubkeys || n_total_pubkeys != n_ephemeral_input_tags) {
        return 0;
    }

    /* Reject proofs with too many used inputs in USE_REDUCED_SURJECTION_PROOF_SIZE mode */
    if (n_used_pubkeys > SECP256K1_SURJECTIONPROOF_MAX_USED_INPUTS) {
        return 0;
    }

    if (secp256k1_surjection_compute_public_keys(ring_pubkeys, n_used_pubkeys, ephemeral_input_tags, n_total_pubkeys, proof->used_inputs, ephemeral_output_tag, 0, NULL) == 0) {
        return 0;
    }

    /* Verify signature */
    rsizes[0] = (int) n_used_pubkeys;
    for (i = 0; i < n_used_pubkeys; i++) {
        int overflow = 0;
        secp256k1_scalar_set_b32(&borromean_s[i], &proof->data[32 + 32 * i], &overflow);
        if (overflow == 1) {
            return 0;
        }
    }
    secp256k1_surjection_genmessage(msg32, ephemeral_input_tags, n_total_pubkeys, ephemeral_output_tag);
    return secp256k1_borromean_verify(&ctx->ecmult_ctx, NULL, &proof->data[0], borromean_s, ring_pubkeys, rsizes, 1, msg32, 32);
}